

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

void fetchTransformedBilinear_slow_fetcher<(TextureBlendType)5,(QPixelLayout::BPP)6,unsigned_int>
               (uint *buf1,uint *buf2,ushort *distxs,ushort *distys,int len,QTextureData *image,
               qreal *fx,qreal *fy,qreal *fw,qreal fdx,qreal fdy,qreal fdw)

{
  uint uVar1;
  uchar *puVar2;
  long lVar3;
  double __x;
  double dVar4;
  double dVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  double __x_00;
  double dVar15;
  
  if (0 < len) {
    puVar2 = image->imageData;
    lVar3 = image->bytesPerLine;
    dVar15 = *fw;
    uVar14 = 0;
    do {
      dVar4 = (double)(-(ulong)(dVar15 == 0.0) & 0x40d0000000000000 |
                      ~-(ulong)(dVar15 == 0.0) & (ulong)(1.0 / dVar15));
      dVar15 = *fx;
      __x = dVar4 * dVar15 + -0.5;
      __x_00 = *fy * dVar4 + -0.5;
      dVar4 = floor(__x);
      dVar5 = floor(__x_00);
      distxs[uVar14] = (ushort)(int)((__x - (double)(int)dVar4) * 65536.0);
      distys[uVar14] = (ushort)(int)((__x_00 - (double)(int)dVar5) * 65536.0);
      uVar9 = image->width;
      uVar1 = image->height;
      iVar6 = (int)dVar4 % (int)uVar9;
      uVar7 = iVar6 >> 0x1f & uVar9;
      uVar12 = uVar7 + iVar6 + 1;
      if (uVar12 == uVar9) {
        uVar12 = 0;
      }
      iVar10 = (int)dVar5 % (int)uVar1;
      uVar8 = iVar10 >> 0x1f & uVar1;
      uVar9 = uVar8 + iVar10 + 1;
      if (uVar9 == uVar1) {
        uVar9 = 0;
      }
      lVar13 = (int)(uVar8 + iVar10) * lVar3;
      lVar11 = (long)(int)(uVar7 + iVar6);
      buf1[uVar14 * 2] = *(uint *)(puVar2 + lVar11 * 4 + lVar13);
      buf1[uVar14 * 2 + 1] = *(uint *)(puVar2 + (long)(int)uVar12 * 4 + lVar13);
      lVar13 = (int)uVar9 * lVar3;
      buf2[uVar14 * 2] = *(uint *)(puVar2 + lVar11 * 4 + lVar13);
      buf2[uVar14 * 2 + 1] = *(uint *)(puVar2 + (long)(int)uVar12 * 4 + lVar13);
      *fx = dVar15 + fdx;
      *fy = *fy + fdy;
      dVar15 = *fw + fdw;
      *fw = dVar15;
      uVar14 = uVar14 + 1;
    } while ((uint)len != uVar14);
  }
  return;
}

Assistant:

static void QT_FASTCALL fetchTransformedBilinear_slow_fetcher(T *buf1, T *buf2, ushort *distxs, ushort *distys,
                                                              const int len, const QTextureData &image,
                                                              qreal &fx, qreal &fy, qreal &fw,
                                                              const qreal fdx, const qreal fdy, const qreal fdw)
{
    const QPixelLayout &layout = qPixelLayouts[image.format];
    constexpr bool useFetch = (bpp < QPixelLayout::BPP32);
    if (useFetch)
        Q_ASSERT(sizeof(T) == sizeof(uint));
    else
        Q_ASSERT(layout.bpp == bpp);

    const Fetch1PixelFunc fetch1 = (bpp == QPixelLayout::BPPNone) ? fetch1PixelTable[layout.bpp] : fetch1Pixel<bpp>;

    for (int i = 0; i < len; ++i) {
        const qreal iw = fw == 0 ? 16384 : 1 / fw;
        const qreal px = fx * iw - qreal(0.5);
        const qreal py = fy * iw - qreal(0.5);

        int x1 = qFloor(px);
        int x2;
        int y1 = qFloor(py);
        int y2;

        distxs[i] = ushort((px - x1) * (1<<16));
        distys[i] = ushort((py - y1) * (1<<16));

        fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
        fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);

        const uchar *s1 = image.scanLine(y1);
        const uchar *s2 = image.scanLine(y2);
        if constexpr (useFetch) {
            buf1[i * 2 + 0] = fetch1(s1, x1);
            buf1[i * 2 + 1] = fetch1(s1, x2);
            buf2[i * 2 + 0] = fetch1(s2, x1);
            buf2[i * 2 + 1] = fetch1(s2, x2);
        } else {
            buf1[i * 2 + 0] = reinterpret_cast<const T *>(s1)[x1];
            buf1[i * 2 + 1] = reinterpret_cast<const T *>(s1)[x2];
            buf2[i * 2 + 0] = reinterpret_cast<const T *>(s2)[x1];
            buf2[i * 2 + 1] = reinterpret_cast<const T *>(s2)[x2];
        }

        fx += fdx;
        fy += fdy;
        fw += fdw;
    }
}